

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::visitSIMDShuffle(BinaryInstWriter *this,SIMDShuffle *curr)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  size_t in_RCX;
  void *__buf;
  long lVar1;
  LEB<unsigned_int,_unsigned_char> local_30;
  uchar local_2a;
  uchar local_29;
  
  this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  local_2a = 0xfd;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_00,&local_2a);
  local_30.value = 0xd;
  LEB<unsigned_int,_unsigned_char>::write(&local_30,(int)this_00,__buf,in_RCX);
  lVar1 = 0;
  do {
    local_29 = (curr->mask)._M_elems[lVar1];
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_29);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  return;
}

Assistant:

void BinaryInstWriter::visitSIMDShuffle(SIMDShuffle* curr) {
  o << int8_t(BinaryConsts::SIMDPrefix) << U32LEB(BinaryConsts::I8x16Shuffle);
  for (uint8_t m : curr->mask) {
    o << m;
  }
}